

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *fg_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  uint uVar1;
  ImVec2 IVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  ImDrawVert *pIVar5;
  ulong uVar6;
  unsigned_short *puVar7;
  int n;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar15;
  undefined1 auVar14 [16];
  undefined1 in_XMM2 [16];
  undefined8 uVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 local_88 [8];
  undefined8 uStack_80;
  ImVec2 triangle [3];
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (show_mesh || show_aabb) {
    if ((draw_list->IdxBuffer).Size < 1) {
      puVar7 = (unsigned_short *)0x0;
    }
    else {
      puVar7 = (draw_list->IdxBuffer).Data;
    }
    local_58._0_4_ = (draw_cmd->ClipRect).x;
    local_58._4_4_ = (draw_cmd->ClipRect).y;
    uStack_50 = 0;
    local_48._0_4_ = (draw_cmd->ClipRect).z;
    local_48._4_4_ = (draw_cmd->ClipRect).w;
    uStack_40 = 0;
    uVar1 = fg_draw_list->Flags;
    fg_draw_list->Flags = uVar1 & 0xfffffffe;
    uStack_80 = 0x7f7fffff7f7fffff;
    local_88 = (undefined1  [8])0xff7fffffff7fffff;
    for (uVar6 = (ulong)(uint)elem_offset; (uint)uVar6 < draw_cmd->ElemCount + elem_offset;
        uVar6 = uVar6 + 3) {
      triangle[0].x = 0.0;
      triangle[0].y = 0.0;
      triangle[1].x = 0.0;
      triangle[1].y = 0.0;
      triangle[2].x = 0.0;
      triangle[2].y = 0.0;
      for (lVar8 = 0; uVar19 = in_XMM2._8_8_, lVar8 != 3; lVar8 = lVar8 + 1) {
        uVar9 = (uint)(uVar6 + lVar8);
        if (puVar7 != (unsigned_short *)0x0) {
          uVar9 = (uint)puVar7[uVar6 + lVar8 & 0xffffffff];
        }
        pIVar5 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar9);
        IVar2 = pIVar5->pos;
        fVar13 = IVar2.x;
        fVar15 = IVar2.y;
        triangle[lVar8] = IVar2;
        uVar9 = -(uint)(local_88._0_4_ < fVar13);
        uVar10 = -(uint)(local_88._4_4_ < fVar15);
        auVar3._4_8_ = uVar19;
        auVar3._0_4_ = fVar15;
        auVar16._0_8_ = auVar3._0_8_ << 0x20;
        auVar16._8_4_ = fVar13;
        auVar16._12_4_ = fVar15;
        uVar11 = -(uint)(fVar13 < local_88._8_4_);
        uVar12 = -(uint)(fVar15 < local_88._12_4_);
        auVar4._4_8_ = auVar16._8_8_;
        auVar4._0_4_ = -(uint)(fVar15 < local_88._4_4_);
        auVar17._0_8_ = auVar4._0_8_ << 0x20;
        auVar17._8_4_ = uVar11;
        auVar17._12_4_ = uVar12;
        auVar14._0_4_ = (uint)fVar13 & uVar9;
        auVar14._4_4_ = (uint)fVar15 & uVar10;
        auVar14._8_4_ = (uint)fVar13 & uVar11;
        auVar14._12_4_ = (uint)fVar15 & uVar12;
        auVar18._0_8_ = ~CONCAT44(uVar10,uVar9) & local_88;
        auVar18._8_8_ = ~auVar17._8_8_ & local_88._8_8_;
        in_XMM2 = auVar18 | auVar14;
        _local_88 = in_XMM2;
      }
      if (show_mesh) {
        ImDrawList::AddPolyline(fg_draw_list,triangle,3,0xff00ffff,true,1.0);
      }
    }
    if (show_aabb) {
      triangle[0].x = (float)(int)(float)local_58;
      triangle[0].y = (float)(int)local_58._4_4_;
      local_60.x = (float)(int)(float)local_48;
      local_60.y = (float)(int)local_48._4_4_;
      ImDrawList::AddRect(fg_draw_list,triangle,&local_60,0xffff00ff,0.0,0xf,1.0);
      triangle[0].x = (float)(int)(float)uStack_80;
      triangle[0].y = (float)(int)uStack_80._4_4_;
      local_60.x = (float)(int)(float)local_88._0_4_;
      local_60.y = (float)(int)(float)local_88._4_4_;
      ImDrawList::AddRect(fg_draw_list,triangle,&local_60,0xffffff00,0.0,0xf,1.0);
    }
    fg_draw_list->Flags = uVar1;
    return;
  }
  __assert_fail("show_mesh || show_aabb",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x3cec,
                "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
               );
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImDrawList* fg_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }